

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O1

uint aom_masked_sad64x16_ssse3
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint8_t *second_pred,
               uint8_t *msk,int msk_stride,int invert_mask)

{
  uint8_t *puVar1;
  int y;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  short sVar6;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  short sVar15;
  undefined1 auVar16 [16];
  short sVar17;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  undefined1 auVar18 [16];
  undefined1 auVar26 [16];
  short sVar43;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar36 [16];
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  undefined1 auVar19 [16];
  undefined1 auVar29 [16];
  undefined1 auVar20 [16];
  undefined1 auVar30 [16];
  undefined1 auVar21 [16];
  undefined1 auVar31 [16];
  undefined1 auVar22 [16];
  undefined1 auVar32 [16];
  undefined1 auVar23 [16];
  undefined1 auVar33 [16];
  undefined1 auVar24 [16];
  undefined1 auVar34 [16];
  undefined1 auVar25 [16];
  undefined1 auVar35 [16];
  undefined1 auVar45 [16];
  undefined1 auVar53 [16];
  undefined1 auVar46 [16];
  undefined1 auVar54 [16];
  undefined1 auVar47 [16];
  undefined1 auVar55 [16];
  undefined1 auVar48 [16];
  undefined1 auVar56 [16];
  undefined1 auVar49 [16];
  undefined1 auVar57 [16];
  undefined1 auVar50 [16];
  undefined1 auVar58 [16];
  undefined1 auVar51 [16];
  undefined1 auVar59 [16];
  
  if (invert_mask == 0) {
    iVar2 = 0;
    iVar4 = 0;
    iVar5 = 0;
    do {
      uVar3 = 0xfffffffffffffff0;
      do {
        auVar8 = *(undefined1 (*) [16])(ref + uVar3 + 0x10);
        puVar1 = second_pred + uVar3 + 0x10;
        auVar36 = *(undefined1 (*) [16])(msk + uVar3 + 0x10);
        auVar35._0_14_ = auVar8._0_14_;
        auVar35[0xe] = auVar8[7];
        auVar35[0xf] = puVar1[7];
        auVar34._14_2_ = auVar35._14_2_;
        auVar34._0_13_ = auVar8._0_13_;
        auVar34[0xd] = puVar1[6];
        auVar33._13_3_ = auVar34._13_3_;
        auVar33._0_12_ = auVar8._0_12_;
        auVar33[0xc] = auVar8[6];
        auVar32._12_4_ = auVar33._12_4_;
        auVar32._0_11_ = auVar8._0_11_;
        auVar32[0xb] = puVar1[5];
        auVar31._11_5_ = auVar32._11_5_;
        auVar31._0_10_ = auVar8._0_10_;
        auVar31[10] = auVar8[5];
        auVar30._10_6_ = auVar31._10_6_;
        auVar30._0_9_ = auVar8._0_9_;
        auVar30[9] = puVar1[4];
        auVar29._9_7_ = auVar30._9_7_;
        auVar29._0_8_ = auVar8._0_8_;
        auVar29[8] = auVar8[4];
        auVar28._8_8_ = auVar29._8_8_;
        auVar28[7] = puVar1[3];
        auVar28[6] = auVar8[3];
        auVar28[5] = puVar1[2];
        auVar28[4] = auVar8[2];
        auVar28[3] = puVar1[1];
        auVar28[2] = auVar8[1];
        auVar28[0] = auVar8[0];
        auVar28[1] = *puVar1;
        auVar59._0_14_ = auVar36._0_14_;
        auVar59[0xe] = auVar36[7];
        auVar59[0xf] = '@' - auVar36[7];
        auVar58._14_2_ = auVar59._14_2_;
        auVar58._0_13_ = auVar36._0_13_;
        auVar58[0xd] = '@' - auVar36[6];
        auVar57._13_3_ = auVar58._13_3_;
        auVar57._0_12_ = auVar36._0_12_;
        auVar57[0xc] = auVar36[6];
        auVar56._12_4_ = auVar57._12_4_;
        auVar56._0_11_ = auVar36._0_11_;
        auVar56[0xb] = '@' - auVar36[5];
        auVar55._11_5_ = auVar56._11_5_;
        auVar55._0_10_ = auVar36._0_10_;
        auVar55[10] = auVar36[5];
        auVar54._10_6_ = auVar55._10_6_;
        auVar54._0_9_ = auVar36._0_9_;
        auVar54[9] = '@' - auVar36[4];
        auVar53._9_7_ = auVar54._9_7_;
        auVar53._0_8_ = auVar36._0_8_;
        auVar53[8] = auVar36[4];
        auVar52._8_8_ = auVar53._8_8_;
        auVar52[7] = '@' - auVar36[3];
        auVar52[6] = auVar36[3];
        auVar52[5] = '@' - auVar36[2];
        auVar52[4] = auVar36[2];
        auVar52[3] = '@' - auVar36[1];
        auVar52[2] = auVar36[1];
        auVar52[1] = '@' - auVar36[0];
        auVar52[0] = auVar36[0];
        auVar26 = pmaddubsw(auVar28,auVar52);
        sVar17 = pavgw(auVar26._0_2_ >> 5,0);
        sVar37 = pavgw(auVar26._2_2_ >> 5,0);
        sVar38 = pavgw(auVar26._4_2_ >> 5,0);
        sVar39 = pavgw(auVar26._6_2_ >> 5,0);
        sVar40 = pavgw(auVar26._8_2_ >> 5,0);
        sVar41 = pavgw(auVar26._10_2_ >> 5,0);
        sVar42 = pavgw(auVar26._12_2_ >> 5,0);
        sVar43 = pavgw(auVar26._14_2_ >> 5,0);
        auVar26[1] = puVar1[8];
        auVar26[0] = auVar8[8];
        auVar26[2] = auVar8[9];
        auVar26[3] = puVar1[9];
        auVar26[4] = auVar8[10];
        auVar26[5] = puVar1[10];
        auVar26[6] = auVar8[0xb];
        auVar26[7] = puVar1[0xb];
        auVar26[8] = auVar8[0xc];
        auVar26[9] = puVar1[0xc];
        auVar26[10] = auVar8[0xd];
        auVar26[0xb] = puVar1[0xd];
        auVar26[0xc] = auVar8[0xe];
        auVar26[0xd] = puVar1[0xe];
        auVar26[0xe] = auVar8[0xf];
        auVar26[0xf] = puVar1[0xf];
        auVar8[1] = '@' - auVar36[8];
        auVar8[0] = auVar36[8];
        auVar8[2] = auVar36[9];
        auVar8[3] = '@' - auVar36[9];
        auVar8[4] = auVar36[10];
        auVar8[5] = '@' - auVar36[10];
        auVar8[6] = auVar36[0xb];
        auVar8[7] = '@' - auVar36[0xb];
        auVar8[8] = auVar36[0xc];
        auVar8[9] = '@' - auVar36[0xc];
        auVar8[10] = auVar36[0xd];
        auVar8[0xb] = '@' - auVar36[0xd];
        auVar8[0xc] = auVar36[0xe];
        auVar8[0xd] = '@' - auVar36[0xe];
        auVar8[0xe] = auVar36[0xf];
        auVar8[0xf] = '@' - auVar36[0xf];
        auVar8 = pmaddubsw(auVar26,auVar8);
        sVar6 = pavgw(auVar8._0_2_ >> 5,0);
        sVar9 = pavgw(auVar8._2_2_ >> 5,0);
        sVar10 = pavgw(auVar8._4_2_ >> 5,0);
        sVar11 = pavgw(auVar8._6_2_ >> 5,0);
        sVar12 = pavgw(auVar8._8_2_ >> 5,0);
        sVar13 = pavgw(auVar8._10_2_ >> 5,0);
        sVar14 = pavgw(auVar8._12_2_ >> 5,0);
        sVar15 = pavgw(auVar8._14_2_ >> 5,0);
        auVar36[1] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
        auVar36[0] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
        auVar36[2] = (0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38);
        auVar36[3] = (0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39);
        auVar36[4] = (0 < sVar40) * (sVar40 < 0x100) * (char)sVar40 - (0xff < sVar40);
        auVar36[5] = (0 < sVar41) * (sVar41 < 0x100) * (char)sVar41 - (0xff < sVar41);
        auVar36[6] = (0 < sVar42) * (sVar42 < 0x100) * (char)sVar42 - (0xff < sVar42);
        auVar36[7] = (0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43);
        auVar36[8] = (0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6);
        auVar36[9] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
        auVar36[10] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
        auVar36[0xb] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
        auVar36[0xc] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
        auVar36[0xd] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
        auVar36[0xe] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
        auVar36[0xf] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
        auVar8 = psadbw(auVar36,*(undefined1 (*) [16])(src + uVar3 + 0x10));
        iVar4 = iVar4 + auVar8._0_4_;
        iVar5 = iVar5 + auVar8._8_4_;
        uVar3 = uVar3 + 0x10;
      } while (uVar3 < 0x30);
      src = src + src_stride;
      ref = ref + ref_stride;
      second_pred = second_pred + 0x40;
      msk = msk + msk_stride;
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x10);
  }
  else {
    iVar2 = 0;
    iVar4 = 0;
    iVar5 = 0;
    do {
      uVar3 = 0xfffffffffffffff0;
      do {
        auVar8 = *(undefined1 (*) [16])(second_pred + uVar3 + 0x10);
        puVar1 = ref + uVar3 + 0x10;
        auVar36 = *(undefined1 (*) [16])(msk + uVar3 + 0x10);
        auVar25._0_14_ = auVar8._0_14_;
        auVar25[0xe] = auVar8[7];
        auVar25[0xf] = puVar1[7];
        auVar24._14_2_ = auVar25._14_2_;
        auVar24._0_13_ = auVar8._0_13_;
        auVar24[0xd] = puVar1[6];
        auVar23._13_3_ = auVar24._13_3_;
        auVar23._0_12_ = auVar8._0_12_;
        auVar23[0xc] = auVar8[6];
        auVar22._12_4_ = auVar23._12_4_;
        auVar22._0_11_ = auVar8._0_11_;
        auVar22[0xb] = puVar1[5];
        auVar21._11_5_ = auVar22._11_5_;
        auVar21._0_10_ = auVar8._0_10_;
        auVar21[10] = auVar8[5];
        auVar20._10_6_ = auVar21._10_6_;
        auVar20._0_9_ = auVar8._0_9_;
        auVar20[9] = puVar1[4];
        auVar19._9_7_ = auVar20._9_7_;
        auVar19._0_8_ = auVar8._0_8_;
        auVar19[8] = auVar8[4];
        auVar18._8_8_ = auVar19._8_8_;
        auVar18[7] = puVar1[3];
        auVar18[6] = auVar8[3];
        auVar18[5] = puVar1[2];
        auVar18[4] = auVar8[2];
        auVar18[3] = puVar1[1];
        auVar18[2] = auVar8[1];
        auVar18[0] = auVar8[0];
        auVar18[1] = *puVar1;
        auVar51._0_14_ = auVar36._0_14_;
        auVar51[0xe] = auVar36[7];
        auVar51[0xf] = '@' - auVar36[7];
        auVar50._14_2_ = auVar51._14_2_;
        auVar50._0_13_ = auVar36._0_13_;
        auVar50[0xd] = '@' - auVar36[6];
        auVar49._13_3_ = auVar50._13_3_;
        auVar49._0_12_ = auVar36._0_12_;
        auVar49[0xc] = auVar36[6];
        auVar48._12_4_ = auVar49._12_4_;
        auVar48._0_11_ = auVar36._0_11_;
        auVar48[0xb] = '@' - auVar36[5];
        auVar47._11_5_ = auVar48._11_5_;
        auVar47._0_10_ = auVar36._0_10_;
        auVar47[10] = auVar36[5];
        auVar46._10_6_ = auVar47._10_6_;
        auVar46._0_9_ = auVar36._0_9_;
        auVar46[9] = '@' - auVar36[4];
        auVar45._9_7_ = auVar46._9_7_;
        auVar45._0_8_ = auVar36._0_8_;
        auVar45[8] = auVar36[4];
        auVar44._8_8_ = auVar45._8_8_;
        auVar44[7] = '@' - auVar36[3];
        auVar44[6] = auVar36[3];
        auVar44[5] = '@' - auVar36[2];
        auVar44[4] = auVar36[2];
        auVar44[3] = '@' - auVar36[1];
        auVar44[2] = auVar36[1];
        auVar44[1] = '@' - auVar36[0];
        auVar44[0] = auVar36[0];
        auVar26 = pmaddubsw(auVar18,auVar44);
        sVar17 = pavgw(auVar26._0_2_ >> 5,0);
        sVar37 = pavgw(auVar26._2_2_ >> 5,0);
        sVar38 = pavgw(auVar26._4_2_ >> 5,0);
        sVar39 = pavgw(auVar26._6_2_ >> 5,0);
        sVar40 = pavgw(auVar26._8_2_ >> 5,0);
        sVar41 = pavgw(auVar26._10_2_ >> 5,0);
        sVar42 = pavgw(auVar26._12_2_ >> 5,0);
        sVar43 = pavgw(auVar26._14_2_ >> 5,0);
        auVar7[1] = puVar1[8];
        auVar7[0] = auVar8[8];
        auVar7[2] = auVar8[9];
        auVar7[3] = puVar1[9];
        auVar7[4] = auVar8[10];
        auVar7[5] = puVar1[10];
        auVar7[6] = auVar8[0xb];
        auVar7[7] = puVar1[0xb];
        auVar7[8] = auVar8[0xc];
        auVar7[9] = puVar1[0xc];
        auVar7[10] = auVar8[0xd];
        auVar7[0xb] = puVar1[0xd];
        auVar7[0xc] = auVar8[0xe];
        auVar7[0xd] = puVar1[0xe];
        auVar7[0xe] = auVar8[0xf];
        auVar7[0xf] = puVar1[0xf];
        auVar16[1] = '@' - auVar36[8];
        auVar16[0] = auVar36[8];
        auVar16[2] = auVar36[9];
        auVar16[3] = '@' - auVar36[9];
        auVar16[4] = auVar36[10];
        auVar16[5] = '@' - auVar36[10];
        auVar16[6] = auVar36[0xb];
        auVar16[7] = '@' - auVar36[0xb];
        auVar16[8] = auVar36[0xc];
        auVar16[9] = '@' - auVar36[0xc];
        auVar16[10] = auVar36[0xd];
        auVar16[0xb] = '@' - auVar36[0xd];
        auVar16[0xc] = auVar36[0xe];
        auVar16[0xd] = '@' - auVar36[0xe];
        auVar16[0xe] = auVar36[0xf];
        auVar16[0xf] = '@' - auVar36[0xf];
        auVar8 = pmaddubsw(auVar7,auVar16);
        sVar6 = pavgw(auVar8._0_2_ >> 5,0);
        sVar9 = pavgw(auVar8._2_2_ >> 5,0);
        sVar10 = pavgw(auVar8._4_2_ >> 5,0);
        sVar11 = pavgw(auVar8._6_2_ >> 5,0);
        sVar12 = pavgw(auVar8._8_2_ >> 5,0);
        sVar13 = pavgw(auVar8._10_2_ >> 5,0);
        sVar14 = pavgw(auVar8._12_2_ >> 5,0);
        sVar15 = pavgw(auVar8._14_2_ >> 5,0);
        auVar27[1] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
        auVar27[0] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
        auVar27[2] = (0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38);
        auVar27[3] = (0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39);
        auVar27[4] = (0 < sVar40) * (sVar40 < 0x100) * (char)sVar40 - (0xff < sVar40);
        auVar27[5] = (0 < sVar41) * (sVar41 < 0x100) * (char)sVar41 - (0xff < sVar41);
        auVar27[6] = (0 < sVar42) * (sVar42 < 0x100) * (char)sVar42 - (0xff < sVar42);
        auVar27[7] = (0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43);
        auVar27[8] = (0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6);
        auVar27[9] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
        auVar27[10] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
        auVar27[0xb] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
        auVar27[0xc] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
        auVar27[0xd] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
        auVar27[0xe] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
        auVar27[0xf] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
        auVar8 = psadbw(auVar27,*(undefined1 (*) [16])(src + uVar3 + 0x10));
        iVar4 = iVar4 + auVar8._0_4_;
        iVar5 = iVar5 + auVar8._8_4_;
        uVar3 = uVar3 + 0x10;
      } while (uVar3 < 0x30);
      src = src + src_stride;
      second_pred = second_pred + 0x40;
      ref = ref + ref_stride;
      msk = msk + msk_stride;
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x10);
  }
  return iVar5 + iVar4;
}

Assistant:

static inline unsigned int masked_sad_ssse3(const uint8_t *src_ptr,
                                            int src_stride,
                                            const uint8_t *a_ptr, int a_stride,
                                            const uint8_t *b_ptr, int b_stride,
                                            const uint8_t *m_ptr, int m_stride,
                                            int width, int height) {
  int x, y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 16) {
      const __m128i src = _mm_loadu_si128((const __m128i *)&src_ptr[x]);
      const __m128i a = _mm_loadu_si128((const __m128i *)&a_ptr[x]);
      const __m128i b = _mm_loadu_si128((const __m128i *)&b_ptr[x]);
      const __m128i m = _mm_loadu_si128((const __m128i *)&m_ptr[x]);
      const __m128i m_inv = _mm_sub_epi8(mask_max, m);

      // Calculate 16 predicted pixels.
      // Note that the maximum value of any entry of 'pred_l' or 'pred_r'
      // is 64 * 255, so we have plenty of space to add rounding constants.
      const __m128i data_l = _mm_unpacklo_epi8(a, b);
      const __m128i mask_l = _mm_unpacklo_epi8(m, m_inv);
      __m128i pred_l = _mm_maddubs_epi16(data_l, mask_l);
      pred_l = xx_roundn_epu16(pred_l, AOM_BLEND_A64_ROUND_BITS);

      const __m128i data_r = _mm_unpackhi_epi8(a, b);
      const __m128i mask_r = _mm_unpackhi_epi8(m, m_inv);
      __m128i pred_r = _mm_maddubs_epi16(data_r, mask_r);
      pred_r = xx_roundn_epu16(pred_r, AOM_BLEND_A64_ROUND_BITS);

      const __m128i pred = _mm_packus_epi16(pred_l, pred_r);
      res = _mm_add_epi32(res, _mm_sad_epu8(pred, src));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // At this point, we have two 32-bit partial SADs in lanes 0 and 2 of 'res'.
  unsigned int sad = (unsigned int)(_mm_cvtsi128_si32(res) +
                                    _mm_cvtsi128_si32(_mm_srli_si128(res, 8)));
  return sad;
}